

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t solaris_sparse_parse(archive_read *a,tar *tar,archive_entry *entry,char *p)

{
  wchar_t wVar1;
  int64_t iVar2;
  uint uVar3;
  size_t char_cnt;
  long offset;
  char *p_00;
  byte bVar4;
  
  wVar1 = L'\xffffffec';
  if (*(char *)&entry->archive == ' ') {
    uVar3 = 1;
    offset = 0;
    do {
      p_00 = (char *)((long)&entry->archive + 1);
      for (char_cnt = 0; bVar4 = p_00[char_cnt], (bVar4 & 0xdf) != 0; char_cnt = char_cnt + 1) {
        if ((byte)(bVar4 - 0x3a) < 0xf6) {
          return L'\xffffffec';
        }
      }
      iVar2 = tar_atol_base_n(p_00,char_cnt,L'\n');
      if (iVar2 < 0) {
        return L'\xffffffec';
      }
      entry = (archive_entry *)(p_00 + char_cnt);
      if (iVar2 - offset != 0 && offset <= iVar2) {
        wVar1 = gnu_add_sparse_entry(a,tar,offset,iVar2 - offset);
        if (wVar1 != L'\0') {
          return L'\xffffffe2';
        }
        tar->sparse_last->hole = uVar3;
        bVar4 = *(byte *)&entry->archive;
      }
      uVar3 = uVar3 ^ 1;
      offset = iVar2;
    } while (bVar4 != 0);
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

static int
solaris_sparse_parse(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const char *p)
{
	const char *e;
	int64_t start, end;
	int hole = 1;

	(void)entry; /* UNUSED */

	end = 0;
	if (*p == ' ')
		p++;
	else
		return (ARCHIVE_WARN);
	for (;;) {
		e = p;
		while (*e != '\0' && *e != ' ') {
			if (*e < '0' || *e > '9')
				return (ARCHIVE_WARN);
			e++;
		}
		start = end;
		end = tar_atol10(p, e - p);
		if (end < 0)
			return (ARCHIVE_WARN);
		if (start < end) {
			if (gnu_add_sparse_entry(a, tar, start,
			    end - start) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			tar->sparse_last->hole = hole;
		}
		if (*e == '\0')
			return (ARCHIVE_OK);
		p = e + 1;
		hole = hole == 0;
	}
}